

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLReader::refreshCharBuffer(XMLReader *this)

{
  RuntimeException *this_00;
  XMLTranscoder *pXVar1;
  TranscodingException *this_01;
  XMLSize_t XVar2;
  ulong local_50;
  XMLSize_t index_1;
  XMLSize_t XStack_40;
  uint last;
  XMLSize_t index;
  Codes failReason;
  long local_28;
  XMLSize_t spareChars;
  XMLSize_t startInd;
  XMLReader *this_local;
  
  if ((this->fNoMore & 1U) == 0) {
    local_28 = this->fCharsAvail - this->fCharIndex;
    if (local_28 == 0x4000) {
      this_local._7_1_ = true;
    }
    else {
      startInd = (XMLSize_t)this;
      if (this->fTranscoder == (XMLTranscoder *)0x0) {
        if (this->fEncoding == EBCDIC) {
          this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
          RuntimeException::RuntimeException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                     ,0x22a,Reader_EncodingStrRequired,this->fMemoryManager);
          __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
        }
        pXVar1 = XMLTransService::makeNewTranscoderFor
                           (XMLPlatformUtils::fgTransService,this->fEncodingStr,(Codes *)&index,
                            0x4000,this->fMemoryManager);
        this->fTranscoder = pXVar1;
        if (this->fTranscoder == (XMLTranscoder *)0x0) {
          this_01 = (TranscodingException *)__cxa_allocate_exception(0x30);
          TranscodingException::TranscodingException
                    (this_01,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                     ,0x23e,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(this_01,&TranscodingException::typeinfo,
                      TranscodingException::~TranscodingException);
        }
      }
      if ((this->fCalculateSrcOfs & 1U) != 0) {
        for (spareChars = 0; spareChars < this->fCharIndex; spareChars = spareChars + 1) {
          this->fSrcOfsBase = (ulong)this->fCharSizeBuf[spareChars] + this->fSrcOfsBase;
        }
      }
      spareChars = 0;
      if (local_28 != 0) {
        for (XStack_40 = this->fCharIndex; XStack_40 < this->fCharsAvail; XStack_40 = XStack_40 + 1)
        {
          this->fCharBuf[spareChars] = this->fCharBuf[XStack_40];
          this->fCharSizeBuf[spareChars] = this->fCharSizeBuf[XStack_40];
          spareChars = spareChars + 1;
        }
      }
      XVar2 = xcodeMoreChars(this,this->fCharBuf + spareChars,this->fCharSizeBuf + spareChars,
                             0x4000 - local_28);
      this->fCharsAvail = XVar2;
      this->fCharsAvail = local_28 + this->fCharsAvail;
      this->fCharIndex = 0;
      if ((((this->fCharsAvail == 0) && (this->fType == Type_PE)) &&
          (this->fRefFrom == RefFrom_NonLiteral)) && ((this->fSentTrailingSpace & 1U) == 0)) {
        this->fCharBuf[0] = L' ';
        this->fCharsAvail = 1;
        this->fSentTrailingSpace = true;
      }
      if (this->fCharsAvail == 0) {
        this->fNoMore = true;
      }
      if ((this->fCalculateSrcOfs & 1U) != 0) {
        index_1._4_4_ = 0;
        this->fCharOfsBuf[0] = 0;
        for (local_50 = 1; local_50 < this->fCharsAvail; local_50 = local_50 + 1) {
          this->fCharOfsBuf[local_50] = index_1._4_4_ + this->fCharSizeBuf[local_50 - 1];
          index_1._4_4_ = this->fCharOfsBuf[local_50];
        }
      }
      this_local._7_1_ = this->fCharsAvail != 0;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool XMLReader::refreshCharBuffer()
{
    // If the no more flag is set, then don't bother doing anything.
    if (fNoMore)
        return false;

    XMLSize_t startInd;

    // See if we have any existing chars.
    const XMLSize_t spareChars = fCharsAvail - fCharIndex;

    // If we are full, then don't do anything.
    if (spareChars == kCharBufSize)
        return true;

    //
    //  If no transcoder has been created yet, then we never saw the
    //  any encoding="" string and the encoding was not forced, so lets
    //  create one now. We know that it won't change now.
    //
    //  However, note that if we autosensed EBCDIC, then we have to
    //  consider it an error if we never got an encoding since we don't
    //  know what variant of EBCDIC it is.
    //
    if (!fTranscoder)
    {
        if (fEncoding == XMLRecognizer::EBCDIC)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Reader_EncodingStrRequired, fMemoryManager);

        // Ask the transcoding service to make use a transcoder
        XMLTransService::Codes failReason;
        fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
        (
            fEncodingStr
            , failReason
            , kCharBufSize
            , fMemoryManager
        );

        if (!fTranscoder)
        {
            ThrowXMLwithMemMgr1
            (
                TranscodingException
                , XMLExcepts::Trans_CantCreateCvtrFor
                , fEncodingStr
                , fMemoryManager
            );
        }
    }

    //
    //  Add the number of source bytes eaten so far to the base src
    //  offset member.
    //
    if (fCalculateSrcOfs) {
        for (startInd = 0; startInd < fCharIndex; startInd++)
            fSrcOfsBase += fCharSizeBuf[startInd];
    }

    //
    //  If there are spare chars, then move then down to the bottom. We
    //  have to move the char sizes down also.
    //
    startInd = 0;
    if (spareChars)
    {
        for (XMLSize_t index = fCharIndex; index < fCharsAvail; index++)
        {
            fCharBuf[startInd] = fCharBuf[index];
            fCharSizeBuf[startInd] = fCharSizeBuf[index];
            startInd++;
        }
    }

    //
    //  And then get more chars, starting after any spare chars that were
    //  left over from the last time.
    //
    fCharsAvail = xcodeMoreChars
    (
        &fCharBuf[startInd]
        , &fCharSizeBuf[startInd]
        , kCharBufSize - spareChars
    );

    // Add back in the spare chars
    fCharsAvail += spareChars;

    // Reset the buffer index to zero, so we start from the 0th char again
    fCharIndex = 0;

    //
    //  If no chars available, then we have to check for one last thing. If
    //  this is reader for a PE and its not being expanded inside a literal,
    //  then unget a trailing space. We use a boolean to avoid triggering
    //  this more than once.
    //
    if (!fCharsAvail
    &&  (fType == Type_PE)
    &&  (fRefFrom == RefFrom_NonLiteral)
    &&  !fSentTrailingSpace)
    {
        fCharBuf[0] = chSpace;
        fCharsAvail = 1;
        fSentTrailingSpace = true;
    }

    //
    //  If we get here with no more chars, then set the fNoMore flag which
    //  lets us optimize and know without checking that no more chars are
    //  available.
    //
    if (!fCharsAvail)
        fNoMore = true;

    //  Calculate fCharOfsBuf using the elements from fCharBufSize
    if (fCalculateSrcOfs)
    {
        unsigned int last = 0;
        fCharOfsBuf[0] = 0;
        for (XMLSize_t index = 1; index < fCharsAvail; ++index) {
            fCharOfsBuf[index] = last+fCharSizeBuf[index-1];
            last = fCharOfsBuf[index];
            // code was:
            // fCharOfsBuf[index] = fCharOfsBuf[index-1]+fCharSizeBuf[index-1];
            // but on Solaris 64 bit with sun studio 11 this didn't work as
            // every value of fCharOfsBuf[] was 1.
        }
    }

    return (fCharsAvail != 0);
}